

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charmap.h
# Opt level: O0

void __thiscall CCharmapToUni8859_1::CCharmapToUni8859_1(CCharmapToUni8859_1 *this)

{
  long *in_RDI;
  wchar_t i;
  CCharmapToUniSB *in_stack_ffffffffffffffe0;
  int local_c;
  
  CCharmapToUniSB::CCharmapToUniSB(in_stack_ffffffffffffffe0);
  *in_RDI = (long)&PTR__CCharmapToUni8859_1_003cd0b0;
  for (local_c = 0; local_c < 0x100; local_c = local_c + 1) {
    (**(code **)(*in_RDI + 0x38))(in_RDI,local_c);
  }
  return;
}

Assistant:

CCharmapToUni8859_1()
    {
        wchar_t i;
        
        /* 
         *   Initialize our mapping table.  Each 8859-1 code point maps to
         *   the same code point in Unicode, so this is a trivial
         *   translation.  
         */
        for (i = 0 ; i < 256 ; ++i)
            set_mapping(i, i);
    }